

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::generateUnitSequence(double mux,string *seq)

{
  __const_iterator __p;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  double in_XMM0_Qa;
  string muxstr;
  int pw;
  int offset;
  size_type mloc;
  size_type pwerloc;
  string muxstr_1;
  size_type pwerloc_1;
  int pw_1;
  bool noPrefix;
  undefined7 in_stack_fffffffffffffba8;
  char in_stack_fffffffffffffbaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb8;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [2];
  undefined1 in_stack_fffffffffffffdf7;
  double in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [2];
  int local_1b0;
  int local_1ac;
  size_type local_188;
  size_type local_160;
  size_type local_48;
  int local_3c;
  char *local_38;
  char *local_30;
  undefined1 local_19;
  double local_10;
  
  local_19 = 0;
  local_10 = in_XMM0_Qa;
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(in_stack_fffffffffffffbe0,
                  CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                  (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
  if (iVar2 == 0) {
    if (local_10 <= 0.1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (in_stack_fffffffffffffbe0,
                 CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                 (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      local_10 = local_10 * 1000.0;
    }
  }
  else {
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(in_stack_fffffffffffffbe0,
                    CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                    (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
    if (iVar2 == 0) {
      if (100.0 < local_10) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace(in_stack_fffffffffffffbe0,
                CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
        local_10 = local_10 / 1000.0;
      }
    }
    else {
      iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_fffffffffffffbe0,
                      CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                      (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
      if (iVar2 == 0) {
        if (local_10 <= 100.0) {
          local_19 = 1;
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace(in_stack_fffffffffffffbe0,
                  CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                  (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
          local_10 = local_10 / 1000.0;
        }
      }
      else {
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(in_stack_fffffffffffffbe0,
                          CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                          (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
        if (iVar2 == 0) {
          if (0.1 < local_10) {
            local_19 = 1;
          }
          else {
            sVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RSI);
            if ((sVar3 < 4) ||
               (pvVar4 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffbb0,
                                    CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8)),
               *pvVar4 != '^')) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(in_stack_fffffffffffffbe0,
                      CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                      (size_type)in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8);
              local_10 = local_10 * 1000.0;
            }
            else {
              local_19 = 1;
            }
          }
        }
      }
    }
  }
  if ((local_10 != 1.0) || (NAN(local_10))) {
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbb0);
    if (*pvVar4 == '/') {
      local_3c = 1;
      local_48 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0,in_stack_fffffffffffffbaf,0x6df56a);
      if (local_48 != 0xffffffffffffffff) {
        pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0,
                            CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
        local_3c = *pvVar4 + -0x30;
      }
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
      if (local_3c == 1) {
        getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0);
        bVar1 = isNumericalStartCharacter(*pvVar4);
        if (bVar1) {
          getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffbb0,
                    (char *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
        }
      }
      else if (local_3c == 2) {
        sqrt(1.0 / local_10);
        getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0);
        bVar1 = isNumericalStartCharacter(*pvVar4);
        if (bVar1) {
          getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffbb0,
                    (char *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
        }
      }
      else if (local_3c == 3) {
        cbrt(1.0 / local_10);
        getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbb0);
        bVar1 = isNumericalStartCharacter(*pvVar4);
        if (bVar1) {
          getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert(in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffbb0,
                    (char *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
        }
      }
      else {
        getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                     in_stack_fffffffffffffbd0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
    }
    else {
      local_160 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbb0,in_stack_fffffffffffffbaf,0x6df9b1);
      if (local_160 == 0xffffffffffffffff) {
        getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
        std::operator+(in_stack_fffffffffffffbb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffbb0);
        std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
      }
      else {
        local_188 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                              (in_stack_fffffffffffffbd0,(char *)in_stack_fffffffffffffbc8,
                               CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
        if (local_188 < local_160) {
          getMultiplierString_abi_cxx11_(in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
          std::operator+(in_stack_fffffffffffffbb8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbb0);
          std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        }
        else {
          pvVar4 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbb0,
                              CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
          local_1ac = (*pvVar4 == '(') + 1;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(in_stack_fffffffffffffbc8,
                 CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                 (size_type)in_stack_fffffffffffffbb8);
          iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffbb0,
                                     (size_t *)
                                     CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),0
                                    );
          std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
          local_1b0 = iVar2;
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0));
          switch(local_1b0) {
          default:
            getMultiplierString_abi_cxx11_
                      (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            break;
          case 2:
            sqrt(local_10);
            getMultiplierString_abi_cxx11_
                      (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
            in_stack_fffffffffffffbd0 = local_1f0;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbb0);
            in_stack_fffffffffffffbdf = isNumericalStartCharacter(*pvVar4);
            if ((bool)in_stack_fffffffffffffbdf) {
              getMultiplierString_abi_cxx11_
                        (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            }
            break;
          case 3:
            cbrt(local_10);
            getMultiplierString_abi_cxx11_
                      (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
            in_stack_fffffffffffffbb0 = local_310;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbb0);
            bVar1 = isNumericalStartCharacter(*pvVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_
                        (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            }
            break;
          case -3:
            cbrt(1.0 / local_10);
            getMultiplierString_abi_cxx11_
                      (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbb0);
            bVar1 = isNumericalStartCharacter(*pvVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_
                        (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            }
            break;
          case -2:
            sqrt(1.0 / local_10);
            getMultiplierString_abi_cxx11_
                      (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
            this = local_1f0;
            __str = local_250;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(this,__str);
            std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbb0);
            bVar1 = isNumericalStartCharacter(*pvVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_
                        (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(this,__str);
              std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            }
            break;
          case -1:
            getMultiplierString_abi_cxx11_
                      (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
            std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            pvVar4 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbb0);
            bVar1 = isNumericalStartCharacter(*pvVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_
                        (in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
              std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8),
                         in_stack_fffffffffffffbd0);
          std::__cxx11::string::~string(in_stack_fffffffffffffbb0);
        }
      }
    }
  }
  else {
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffbb0);
    __c = (char)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
    if (*pvVar4 == '/') {
      local_30 = (char *)CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8)
                                   );
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffbb0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
      __p._M_current._7_1_ = in_stack_fffffffffffffbdf;
      __p._M_current._0_7_ = in_stack_fffffffffffffbd8;
      local_38 = (char *)CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                   (in_stack_fffffffffffffbd0,__p,__c);
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
               in_stack_fffffffffffffbe8);
  }
  return in_RDI;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}